

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::CeilFun::GetFunctions(void)

{
  LogicalTypeId LVar1;
  LogicalType varargs;
  FunctionSet<duckdb::ScalarFunction> *pFVar2;
  bool bVar3;
  InternalException *this;
  code *pcVar4;
  ScalarFunctionSet *in_RDI;
  pointer this_00;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdbc;
  FunctionNullHandling in_stack_fffffffffffffdc8;
  allocator_type local_231;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_220;
  scalar_function_t func;
  LogicalType local_1e0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1c8;
  string local_1b0;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_190;
  LogicalType local_170;
  ScalarFunction local_158;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::Numeric();
  pFVar2 = &in_RDI->super_FunctionSet<duckdb::ScalarFunction>;
  this_00 = local_220.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (this_00 ==
        local_220.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_220);
      return in_RDI;
    }
    func.super__Function_base._M_manager = (_Manager_type)0x0;
    func._M_invoker = (_Invoker_type)0x0;
    func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    func.super__Function_base._M_functor._8_8_ = 0;
    bVar3 = LogicalType::IsIntegral(this_00);
    if (!bVar3) {
      LVar1 = this_00->id_;
      pcVar4 = BindGenericRoundFunctionDecimal<duckdb::CeilDecimalOperator>;
      if (LVar1 != DECIMAL) {
        pcVar4 = ScalarFunction::UnaryFunction<float,float,duckdb::CeilOperator>;
        if (LVar1 != FLOAT) {
          if (LVar1 != DOUBLE) {
            this = (InternalException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_1b0,"Unimplemented numeric type for function \"ceil\"",
                       (allocator *)&local_231);
            InternalException::InternalException(this,&local_1b0);
            __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pcVar4 = ScalarFunction::UnaryFunction<double,double,duckdb::CeilOperator>;
        }
        ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
        operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                  &func,pcVar4);
        pcVar4 = (bind_scalar_function_t)0x0;
      }
      LogicalType::LogicalType((LogicalType *)&local_1b0,this_00);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_1b0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_1c8,__l,&local_231);
      LogicalType::LogicalType(&local_1e0,this_00);
      ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      function(&local_190,&func);
      LogicalType::LogicalType(&local_170,INVALID);
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs._0_8_ = &local_170;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffdb4;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffdbc;
      ScalarFunction::ScalarFunction
                (&local_158,(vector<duckdb::LogicalType,_true> *)&local_1c8,&local_1e0,&local_190,
                 pcVar4,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffdc8,
                 (bind_lambda_function_t)in_RDI);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&(pFVar2->functions).
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_158);
      ScalarFunction::~ScalarFunction(&local_158);
      LogicalType::~LogicalType(&local_170);
      ::std::_Function_base::~_Function_base(&local_190.super__Function_base);
      LogicalType::~LogicalType(&local_1e0);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1c8);
      LogicalType::~LogicalType((LogicalType *)&local_1b0);
    }
    ::std::_Function_base::~_Function_base(&func.super__Function_base);
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

ScalarFunctionSet CeilFun::GetFunctions() {
	ScalarFunctionSet ceil;
	for (auto &type : LogicalType::Numeric()) {
		scalar_function_t func = nullptr;
		bind_scalar_function_t bind_func = nullptr;
		if (type.IsIntegral()) {
			// no ceil for integral numbers
			continue;
		}
		switch (type.id()) {
		case LogicalTypeId::FLOAT:
			func = ScalarFunction::UnaryFunction<float, float, CeilOperator>;
			break;
		case LogicalTypeId::DOUBLE:
			func = ScalarFunction::UnaryFunction<double, double, CeilOperator>;
			break;
		case LogicalTypeId::DECIMAL:
			bind_func = BindGenericRoundFunctionDecimal<CeilDecimalOperator>;
			break;
		default:
			throw InternalException("Unimplemented numeric type for function \"ceil\"");
		}
		ceil.AddFunction(ScalarFunction({type}, type, func, bind_func));
	}
	return ceil;
}